

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdDmaClipid::emulate_mthd(MthdDmaClipid *this)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  bool local_41;
  byte local_31;
  bool local_22;
  bool prot_err;
  bool bad;
  uint32_t dcls;
  uint32_t limit;
  uint32_t base;
  uint32_t offset_mask;
  MthdDmaClipid *this_local;
  
  pgraph_celsius_pre_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  uVar4 = pgraph_offset_mask(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                              super_RepeatTest.super_Test.chipset);
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.pobj[2];
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.pobj[0] >> 0x14;
  uVar5 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.pobj[0] << 0x34) >> 0x34);
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_surf_limit_clipid =
       (this->super_SingleMthdTest).super_MthdTest.pobj[1] & (uVar4 | 0xf) |
       (uint)(uVar5 != 0x30) << 0x1f;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_surf_base_clipid =
       (uVar1 & 0xfffff000 | uVar2) & (uVar4 | 0xf);
  pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x31,
                      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                      bundle_surf_base_clipid,false);
  pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x32,
                      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                      bundle_surf_limit_clipid,true);
  bVar3 = true;
  if ((uVar5 == 0x30) || (uVar5 == 0x3d)) {
    bVar3 = false;
  }
  if ((uVar5 == 3) &&
     (((this->super_SingleMthdTest).super_MthdTest.cls == 0x38 ||
      ((this->super_SingleMthdTest).super_MthdTest.cls == 0x88)))) {
    bVar3 = false;
  }
  if (((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d << 0x28
             ) < 0) && (bVar3)) {
    nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,2);
  }
  local_22 = ((ulong)(this->super_SingleMthdTest).super_MthdTest.pobj[0] << 0x2e) >> 0x3e != 0 ||
             (uVar2 & 0x3f) != 0;
  if (uVar5 == 0x30) {
    local_22 = false;
  }
  if (local_22) {
    nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,4);
  }
  local_31 = 0;
  if (uVar5 != 0x30) {
    local_41 = false;
    if (bVar3) {
      local_41 = (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                               debug_d << 0x28) < 0;
    }
    local_31 = local_41 ^ 0xff;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_valid =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_valid & 0xefffffff |
       (uint)(local_31 & 1) << 0x1c;
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t offset_mask = pgraph_offset_mask(&chipset) | 0xf;
		uint32_t base = (pobj[2] & ~0xfff) | extr(pobj[0], 20, 12);
		uint32_t limit = pobj[1];
		uint32_t dcls = extr(pobj[0], 0, 12);
		exp.bundle_surf_limit_clipid = (limit & offset_mask) | (dcls != 0x30) << 31;
		exp.bundle_surf_base_clipid = base & offset_mask;
		pgraph_celsius_icmd(&exp, 0x31, exp.bundle_surf_base_clipid, false);
		pgraph_celsius_icmd(&exp, 0x32, exp.bundle_surf_limit_clipid, true);
		bool bad = true;
		if (dcls == 0x30 || dcls == 0x3d)
			bad = false;
		if (dcls == 3 && (cls == 0x38 || cls == 0x88))
			bad = false;
		if (extr(exp.debug_d, 23, 1) && bad) {
			nv04_pgraph_blowup(&exp, 0x2);
		}
		bool prot_err = false;
		if (extr(base, 0, 6))
			prot_err = true;
		if (extr(pobj[0], 16, 2))
			prot_err = true;
		if (dcls == 0x30)
			prot_err = false;
		if (prot_err)
			nv04_pgraph_blowup(&exp, 4);
		insrt(exp.ctx_valid, 28, 1, dcls != 0x30 && !(bad && extr(exp.debug_d, 23, 1)));
	}